

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

cio_http_location_handler * alloc_dummy_handler(void *config)

{
  dummy_handler *handler;
  void *config_local;
  
  config_local = malloc(0xa8);
  if ((cio_http_location_handler *)config_local == (cio_http_location_handler *)0x0) {
    config_local = (void *)0x0;
  }
  else {
    cio_http_location_handler_init((cio_http_location_handler *)config_local);
    cio_write_buffer_head_init((cio_write_buffer *)((long)config_local + 0x68));
    ((cio_http_location_handler *)config_local)->free = free_dummy_handler;
    ((cio_http_location_handler *)config_local)->on_message_complete = dummy_on_message_complete;
  }
  return (cio_http_location_handler *)config_local;
}

Assistant:

static struct cio_http_location_handler *alloc_dummy_handler(const void *config)
{
	(void)config;
	struct dummy_handler *handler = malloc(sizeof(*handler));
	if (cio_unlikely(handler == NULL)) {
		return NULL;
	}

	cio_http_location_handler_init(&handler->handler);
	cio_write_buffer_head_init(&handler->wbh);
	handler->handler.free = free_dummy_handler;
	handler->handler.on_message_complete = dummy_on_message_complete;
	return &handler->handler;
}